

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d.cpp
# Opt level: O0

int __thiscall
ncnn::DeformableConv2D::forward
          (DeformableConv2D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  size_type sVar1;
  float *pfVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float v4;
  float v3;
  float v2;
  float v1;
  float val;
  int c_im;
  float hw;
  float hh;
  float lw;
  float lh;
  bool v4_cond;
  bool v3_cond;
  bool v2_cond;
  bool v1_cond;
  float w4;
  float w3;
  float w2;
  float w1;
  int w_high;
  int h_high;
  int w_low;
  int h_low;
  bool cond;
  float w_im;
  float h_im;
  float mask_;
  float offset_w;
  float offset_h;
  int j;
  int i;
  float sum;
  int oc;
  int w_in;
  int h_in;
  int w_col;
  int h_col;
  float *bias_ptr;
  float *weight_ptr;
  Mat *output;
  int out_h;
  int out_w;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int in_c;
  int h;
  int w;
  bool has_mask;
  Mat *offset;
  Mat *bottom_blob;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_7;
  undefined4 in_stack_fffffffffffff3d0;
  undefined4 in_stack_fffffffffffff3d4;
  size_t in_stack_fffffffffffff3d8;
  undefined8 in_stack_fffffffffffff3e0;
  int _c;
  int in_stack_fffffffffffff3e8;
  float fVar7;
  int in_stack_fffffffffffff3ec;
  Mat *in_stack_fffffffffffff3f0;
  float local_bfc;
  float local_bcc;
  float local_b9c;
  float local_b6c;
  bool local_b45;
  bool local_b44;
  bool local_b43;
  bool local_b42;
  bool local_b41;
  float local_b34;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined4 local_a80;
  Allocator *local_a78;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined8 local_a58;
  char local_a49;
  void *local_a48;
  int *local_a40;
  ulong local_a38;
  int local_a30;
  Allocator *local_a28;
  int local_a20;
  int local_a1c;
  int local_a18;
  undefined4 local_a14;
  int local_a10;
  ulong local_a08;
  float local_a00;
  char local_9f9;
  void *local_9f8;
  int *local_9f0;
  ulong local_9e8;
  int local_9e0;
  Allocator *local_9d8;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  undefined4 local_9c4;
  int local_9c0;
  ulong local_9b8;
  float local_9b0;
  char local_9a9;
  void *local_9a8;
  int *local_9a0;
  ulong local_998;
  int local_990;
  Allocator *local_988;
  int local_980;
  int local_97c;
  int local_978;
  undefined4 local_974;
  int local_970;
  ulong local_968;
  float local_960;
  char local_959;
  void *local_958;
  int *local_950;
  ulong local_948;
  int local_940;
  Allocator *local_938;
  int local_930;
  int local_92c;
  int local_928;
  undefined4 local_924;
  int local_920;
  ulong local_918;
  float local_910;
  float local_90c;
  int local_908;
  float local_904;
  float local_900;
  float local_8fc;
  float local_8f8;
  bool local_8f4;
  bool local_8f3;
  bool local_8f2;
  bool local_8f1;
  float local_8f0;
  float local_8ec;
  float local_8e8;
  float local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  bool local_8cd;
  float local_8cc;
  float local_8c8;
  char local_8c1;
  void *local_8c0;
  int *local_8b8;
  ulong local_8b0;
  int local_8a8;
  Allocator *local_8a0;
  int local_898;
  int local_894;
  int local_890;
  undefined4 local_88c;
  int local_888;
  ulong local_880;
  float local_874;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  Allocator *local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  float local_828;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined4 local_800;
  Allocator *local_7f8;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined8 local_7d8;
  float local_7cc;
  int local_7c8;
  int local_7c4;
  float local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  int local_7b0;
  int local_7ac;
  long local_7a8;
  long local_7a0;
  reference local_798;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  size_t local_780;
  int local_778;
  int local_774;
  int local_770;
  byte local_769;
  const_reference local_768;
  const_reference local_760;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_750;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_748;
  int local_734;
  undefined8 *local_730;
  undefined8 *local_720;
  void **local_710;
  void **local_700;
  void **local_6f0;
  void **local_6e0;
  void **local_6d0;
  undefined8 *local_6c0;
  reference local_6b0;
  long *local_6a8;
  long *local_6a0;
  long *local_698;
  undefined1 local_68d;
  int local_68c;
  const_reference local_688;
  void **local_680;
  undefined1 local_66d;
  int local_66c;
  const_reference local_668;
  void **local_660;
  undefined1 local_64d;
  int local_64c;
  const_reference local_648;
  void **local_640;
  undefined1 local_62d;
  int local_62c;
  const_reference local_628;
  void **local_620;
  undefined1 local_60d;
  int local_60c;
  const_reference local_608;
  void **local_600;
  undefined1 local_5ed;
  int local_5ec;
  const_reference local_5e8;
  undefined8 *local_5e0;
  undefined1 local_5cd;
  int local_5cc;
  const_reference local_5c8;
  undefined8 *local_5c0;
  int local_5ac;
  void **local_5a8;
  int local_59c;
  void **local_598;
  int local_58c;
  void **local_588;
  int local_57c;
  void **local_578;
  int local_56c;
  void **local_568;
  int local_55c;
  undefined8 *local_558;
  int local_54c;
  undefined8 *local_548;
  float local_53c;
  float local_538;
  float local_534;
  float local_530;
  float local_52c;
  float local_528;
  float local_524;
  float local_520;
  float local_51c;
  long *local_518;
  undefined4 local_510;
  float local_50c;
  undefined1 local_505;
  int local_504;
  reference local_500;
  undefined8 *local_4f8;
  int local_4e4;
  undefined8 *local_4e0;
  undefined8 *local_440;
  int local_428;
  undefined4 local_424;
  void **local_420;
  int local_408;
  undefined4 local_404;
  void **local_400;
  int local_3e8;
  undefined4 local_3e4;
  void **local_3e0;
  int local_3c8;
  undefined4 local_3c4;
  void **local_3c0;
  int local_3a8;
  undefined4 local_3a4;
  void **local_3a0;
  undefined8 *local_380;
  undefined8 *local_360;
  void *local_338;
  void *local_328;
  void *local_318;
  void *local_308;
  void *local_2f8;
  reference local_298;
  Allocator *local_290;
  int local_284;
  size_t local_280;
  void *local_278;
  int local_26c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  Allocator *local_258;
  int local_24c;
  size_t local_248;
  void *local_240;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  Allocator *local_220;
  int local_214;
  size_t local_210;
  void *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  Allocator *local_1e8;
  int local_1dc;
  ulong local_1d8;
  void *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  void **local_1b8;
  Allocator *local_1b0;
  int local_1a4;
  ulong local_1a0;
  void *local_198;
  int local_18c;
  int local_188;
  int local_184;
  void **local_180;
  Allocator *local_178;
  int local_16c;
  ulong local_168;
  void *local_160;
  int local_154;
  int local_150;
  int local_14c;
  void **local_148;
  Allocator *local_140;
  int local_134;
  ulong local_130;
  void *local_128;
  int local_11c;
  int local_118;
  int local_114;
  void **local_110;
  Allocator *local_108;
  int local_fc;
  ulong local_f8;
  void *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  void **local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined8 local_50;
  long *local_48;
  undefined8 local_40;
  long *local_38;
  undefined8 local_30;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  undefined8 local_10;
  long *local_8;
  undefined8 extraout_XMM0_Qb;
  
  _c = (int)((ulong)in_stack_fffffffffffff3e0 >> 0x20);
  local_750 = in_RDX;
  local_748 = in_RSI;
  local_760 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_768 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_748,1);
  sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_748);
  local_769 = sVar1 == 3;
  local_770 = local_760->w;
  local_774 = local_760->h;
  local_778 = local_760->c;
  local_780 = local_760->elemsize;
  local_784 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_788 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_78c = ((local_770 + *(int *)(in_RDI + 0xec) + *(int *)(in_RDI + 0xf0)) - local_784) /
              *(int *)(in_RDI + 0xe4) + 1;
  local_790 = ((local_774 + *(int *)(in_RDI + 0xf4) + *(int *)(in_RDI + 0xf8)) - local_788) /
              *(int *)(in_RDI + 0xe8) + 1;
  local_798 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_750,0);
  Mat::create(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8,_c,
              in_stack_fffffffffffff3d8,
              (Allocator *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0));
  local_6b0 = local_798;
  bVar3 = true;
  if (local_798->data != (void *)0x0) {
    local_298 = local_798;
    bVar3 = local_798->cstep * (long)local_798->c == 0;
  }
  if (bVar3) {
    local_734 = -100;
  }
  else {
    local_698 = (long *)(in_RDI + 0x150);
    local_7a0 = *local_698;
    local_6a0 = (long *)(in_RDI + 0x150);
    local_7a8 = *local_6a0;
    if (*(int *)(in_RDI + 0xfc) != 0) {
      local_6a8 = (long *)(in_RDI + 0x198);
      local_7a8 = *local_6a8;
    }
    for (local_7ac = 0; local_7ac < local_790; local_7ac = local_7ac + 1) {
      for (local_7b0 = 0; local_7b0 < local_78c; local_7b0 = local_7b0 + 1) {
        local_7b4 = local_7ac * *(int *)(in_RDI + 0xe8) - *(int *)(in_RDI + 0xf4);
        local_7b8 = local_7b0 * *(int *)(in_RDI + 0xe4) - *(int *)(in_RDI + 0xec);
        for (local_7bc = 0; local_7bc < *(int *)(in_RDI + 0xd0); local_7bc = local_7bc + 1) {
          local_7c0 = 0.0;
          if (*(int *)(in_RDI + 0xfc) != 0) {
            local_7c0 = *(float *)(local_7a8 + (long)local_7bc * 4);
          }
          for (local_7c4 = 0; local_7c4 < *(int *)(in_RDI + 0xd8); local_7c4 = local_7c4 + 1) {
            for (local_7c8 = 0; local_7c8 < *(int *)(in_RDI + 0xd4); local_7c8 = local_7c8 + 1) {
              local_5cc = (local_7c4 * *(int *)(in_RDI + 0xd4) + local_7c8) * 2;
              local_5c0 = &local_818;
              local_22c = local_768->w;
              local_230 = local_768->h;
              local_234 = local_768->d;
              local_240 = (void *)((long)local_768->data +
                                  local_768->cstep * (long)local_5cc * local_768->elemsize);
              local_248 = local_768->elemsize;
              local_24c = local_768->elempack;
              local_258 = local_768->allocator;
              local_228 = &local_818;
              local_68 = (long)local_22c * (long)local_230 * local_248;
              local_548 = &local_818;
              local_7cc = *(float *)((long)local_240 +
                                    (long)local_7b0 * 4 +
                                    (long)local_22c * (long)local_7ac * local_248);
              local_730 = &local_818;
              local_5ec = (local_7c4 * *(int *)(in_RDI + 0xd4) + local_7c8) * 2 + 1;
              local_5e0 = &local_870;
              local_1f4 = local_768->w;
              local_1f8 = local_768->h;
              local_1fc = local_768->d;
              local_208 = (void *)((long)local_768->data +
                                  local_768->cstep * (long)local_5ec * local_768->elemsize);
              local_210 = local_768->elemsize;
              local_214 = local_768->elempack;
              local_220 = local_768->allocator;
              local_1f0 = &local_870;
              local_78 = (long)local_1f4 * (long)local_1f8 * local_210;
              local_558 = &local_870;
              local_828 = *(float *)((long)local_208 +
                                    (long)local_7b0 * 4 +
                                    (long)local_1f4 * (long)local_7ac * local_210);
              local_720 = &local_870;
              local_7e0 = 0;
              local_7e4 = 0;
              local_7e8 = 0;
              local_7ec = 0;
              local_800 = 0;
              local_808 = 0;
              local_810 = 0;
              local_818 = 0;
              local_6c = 0x10;
              local_7c = 0x10;
              local_54c = local_7ac;
              local_55c = local_7ac;
              local_5c8 = local_768;
              local_5cd = 1;
              local_5e8 = local_768;
              local_5ed = 1;
              local_7d8 = 0;
              local_7f0 = 0;
              local_870 = 0;
              local_860 = 0;
              local_858 = 0;
              local_848 = 0;
              local_844 = 0;
              local_840 = 0;
              local_83c = 0;
              local_838 = 0;
              local_830 = 0;
              local_868 = 0;
              local_8c1 = '\0';
              local_380 = local_720;
              local_360 = local_730;
              local_850 = local_220;
              local_7f8 = local_258;
              if ((local_769 & 1) == 0) {
                local_b34 = 1.0;
              }
              else {
                local_608 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                      (local_748,2);
                local_60c = local_7c4 * *(int *)(in_RDI + 0xd4) + local_7c8;
                local_600 = &local_8c0;
                local_1bc = local_608->w;
                local_1c0 = local_608->h;
                local_1c4 = local_608->d;
                local_1d0 = (void *)((long)local_608->data +
                                    local_608->cstep * (long)local_60c * local_608->elemsize);
                local_1d8 = local_608->elemsize;
                local_1dc = local_608->elempack;
                local_1e8 = local_608->allocator;
                local_1b8 = &local_8c0;
                local_8b8 = (int *)0x0;
                local_88c = 1;
                local_88 = (long)local_1bc * (long)local_1c0 * local_1d8;
                local_880 = (local_88 + 0xfU & 0xfffffffffffffff0) / local_1d8;
                local_898 = local_608->dims + -1;
                if (local_608->dims == 4) {
                  local_880 = (long)local_608->w * (long)local_608->h;
                }
                local_8c = 0x10;
                local_60d = 1;
                local_8c1 = '\x01';
                local_568 = &local_8c0;
                local_56c = local_7ac;
                local_b34 = *(float *)((long)local_1d0 +
                                      (long)local_7b0 * 4 +
                                      (long)local_1bc * (long)local_7ac * local_1d8);
                local_8c0 = local_1d0;
                local_8b0 = local_1d8;
                local_8a8 = local_1dc;
                local_8a0 = local_1e8;
                local_894 = local_1bc;
                local_890 = local_1c0;
                local_888 = local_1c4;
              }
              if (local_8c1 != '\0') {
                local_710 = &local_8c0;
                local_3a0 = local_710;
                if (local_8b8 != (int *)0x0) {
                  local_3a4 = 0xffffffff;
                  LOCK();
                  local_3a8 = *local_8b8;
                  *local_8b8 = *local_8b8 + -1;
                  UNLOCK();
                  if (local_3a8 == 1) {
                    if (local_8a0 == (Allocator *)0x0) {
                      local_338 = local_8c0;
                      if (local_8c0 != (void *)0x0) {
                        free(local_8c0);
                      }
                    }
                    else {
                      (*local_8a0->_vptr_Allocator[3])(local_8a0,local_8c0);
                    }
                  }
                }
                local_8c0 = (void *)0x0;
                local_8b0 = 0;
                local_8a8 = 0;
                local_898 = 0;
                local_894 = 0;
                local_890 = 0;
                local_88c = 0;
                local_888 = 0;
                local_880 = 0;
                local_8b8 = (int *)0x0;
              }
              local_874 = local_b34;
              local_8c8 = (float)(local_7b4 + local_7c4 * *(int *)(in_RDI + 0xe0)) + local_7cc;
              local_8cc = (float)(local_7b8 + local_7c8 * *(int *)(in_RDI + 0xdc)) + local_828;
              local_b41 = false;
              if (((-1.0 < local_8c8) && (local_b41 = false, -1.0 < local_8cc)) &&
                 (local_b41 = false, local_8c8 < (float)local_774)) {
                local_b41 = local_8cc < (float)local_770;
              }
              local_8cd = local_b41;
              local_8d4 = 0;
              local_8d8 = 0;
              local_8dc = 0;
              local_8e0 = 0;
              local_8e4 = 0.0;
              local_8e8 = 0.0;
              local_8ec = 0.0;
              local_8f0 = 0.0;
              local_8f1 = false;
              local_8f2 = false;
              local_8f3 = false;
              local_8f4 = false;
              if (local_b41 != false) {
                dVar4 = std::floor((double)(ulong)(uint)local_8c8);
                local_8d4 = (int)SUB84(dVar4,0);
                dVar4 = std::floor((double)(ulong)(uint)local_8cc);
                local_8d8 = (int)SUB84(dVar4,0);
                local_8dc = local_8d4 + 1;
                local_8e0 = local_8d8 + 1;
                local_8f8 = local_8c8 - (float)local_8d4;
                local_8fc = local_8cc - (float)local_8d8;
                local_900 = 1.0 - local_8f8;
                local_904 = 1.0 - local_8fc;
                local_b42 = -1 < local_8d4 && -1 < local_8d8;
                local_8f1 = local_b42;
                local_b43 = -1 < local_8d4 && local_8e0 <= local_770 + -1;
                local_8f2 = local_b43;
                local_b44 = local_8dc <= local_774 + -1 && -1 < local_8d8;
                local_8f3 = local_b44;
                local_b45 = local_8dc <= local_774 + -1 && local_8e0 <= local_770 + -1;
                local_8f4 = local_b45;
                local_8e4 = local_900 * local_904;
                local_8e8 = local_900 * local_8fc;
                local_8ec = local_8f8 * local_904;
                local_8f0 = local_8f8 * local_8fc;
              }
              for (local_908 = 0; local_908 < local_778; local_908 = local_908 + 1) {
                local_90c = 0.0;
                if ((local_8cd & 1U) != 0) {
                  local_959 = '\0';
                  if ((local_8f1 & 1U) == 0) {
                    local_b6c = 0.0;
                  }
                  else {
                    local_620 = &local_958;
                    local_184 = local_760->w;
                    local_188 = local_760->h;
                    local_18c = local_760->d;
                    local_198 = (void *)((long)local_760->data +
                                        local_760->cstep * (long)local_908 * local_760->elemsize);
                    local_1a0 = local_760->elemsize;
                    local_1a4 = local_760->elempack;
                    local_1b0 = local_760->allocator;
                    local_180 = &local_958;
                    local_950 = (int *)0x0;
                    local_924 = 1;
                    local_98 = (long)local_184 * (long)local_188 * local_1a0;
                    local_918 = (local_98 + 0xfU & 0xfffffffffffffff0) / local_1a0;
                    local_930 = local_760->dims + -1;
                    if (local_760->dims == 4) {
                      local_918 = (long)local_760->w * (long)local_760->h;
                    }
                    local_9c = 0x10;
                    local_628 = local_760;
                    local_62c = local_908;
                    local_62d = 1;
                    local_959 = '\x01';
                    local_578 = &local_958;
                    local_57c = local_8d4;
                    local_b6c = *(float *)((long)local_198 +
                                          (long)local_8d8 * 4 +
                                          (long)local_184 * (long)local_8d4 * local_1a0);
                    local_958 = local_198;
                    local_948 = local_1a0;
                    local_940 = local_1a4;
                    local_938 = local_1b0;
                    local_92c = local_184;
                    local_928 = local_188;
                    local_920 = local_18c;
                  }
                  local_90c = 0.0;
                  if (local_959 != '\0') {
                    local_700 = &local_958;
                    local_3c0 = local_700;
                    if (local_950 != (int *)0x0) {
                      local_3c4 = 0xffffffff;
                      LOCK();
                      local_3c8 = *local_950;
                      *local_950 = *local_950 + -1;
                      UNLOCK();
                      if (local_3c8 == 1) {
                        if (local_938 == (Allocator *)0x0) {
                          local_328 = local_958;
                          if (local_958 != (void *)0x0) {
                            free(local_958);
                          }
                        }
                        else {
                          (*local_938->_vptr_Allocator[3])(local_938,local_958);
                        }
                      }
                    }
                    local_958 = (void *)0x0;
                    local_948 = 0;
                    local_940 = 0;
                    local_930 = 0;
                    local_92c = 0;
                    local_928 = 0;
                    local_924 = 0;
                    local_920 = 0;
                    local_918 = 0;
                    local_950 = (int *)0x0;
                  }
                  local_9a9 = '\0';
                  if ((local_8f2 & 1U) == 0) {
                    local_b9c = 0.0;
                  }
                  else {
                    local_640 = &local_9a8;
                    local_14c = local_760->w;
                    local_150 = local_760->h;
                    local_154 = local_760->d;
                    local_160 = (void *)((long)local_760->data +
                                        local_760->cstep * (long)local_908 * local_760->elemsize);
                    local_168 = local_760->elemsize;
                    local_16c = local_760->elempack;
                    local_178 = local_760->allocator;
                    local_148 = &local_9a8;
                    local_9a0 = (int *)0x0;
                    local_974 = 1;
                    local_a8 = (long)local_14c * (long)local_150 * local_168;
                    local_968 = (local_a8 + 0xfU & 0xfffffffffffffff0) / local_168;
                    local_980 = local_760->dims + -1;
                    if (local_760->dims == 4) {
                      local_968 = (long)local_760->w * (long)local_760->h;
                    }
                    local_ac = 0x10;
                    local_648 = local_760;
                    local_64c = local_908;
                    local_64d = 1;
                    local_9a9 = '\x01';
                    local_588 = &local_9a8;
                    local_58c = local_8d4;
                    local_b9c = *(float *)((long)local_160 +
                                          (long)local_8e0 * 4 +
                                          (long)local_14c * (long)local_8d4 * local_168);
                    local_9a8 = local_160;
                    local_998 = local_168;
                    local_990 = local_16c;
                    local_988 = local_178;
                    local_97c = local_14c;
                    local_978 = local_150;
                    local_970 = local_154;
                  }
                  local_910 = local_b6c;
                  if (local_9a9 != '\0') {
                    local_6f0 = &local_9a8;
                    local_3e0 = local_6f0;
                    if (local_9a0 != (int *)0x0) {
                      local_3e4 = 0xffffffff;
                      LOCK();
                      local_3e8 = *local_9a0;
                      *local_9a0 = *local_9a0 + -1;
                      UNLOCK();
                      if (local_3e8 == 1) {
                        if (local_988 == (Allocator *)0x0) {
                          local_318 = local_9a8;
                          if (local_9a8 != (void *)0x0) {
                            free(local_9a8);
                          }
                        }
                        else {
                          (*local_988->_vptr_Allocator[3])(local_988,local_9a8);
                        }
                      }
                    }
                    local_9a8 = (void *)0x0;
                    local_998 = 0;
                    local_990 = 0;
                    local_980 = 0;
                    local_97c = 0;
                    local_978 = 0;
                    local_974 = 0;
                    local_970 = 0;
                    local_968 = 0;
                    local_9a0 = (int *)0x0;
                  }
                  local_9f9 = '\0';
                  if ((local_8f3 & 1U) == 0) {
                    local_bcc = 0.0;
                  }
                  else {
                    local_660 = &local_9f8;
                    local_114 = local_760->w;
                    local_118 = local_760->h;
                    local_11c = local_760->d;
                    local_128 = (void *)((long)local_760->data +
                                        local_760->cstep * (long)local_908 * local_760->elemsize);
                    local_130 = local_760->elemsize;
                    local_134 = local_760->elempack;
                    local_140 = local_760->allocator;
                    local_110 = &local_9f8;
                    local_9f0 = (int *)0x0;
                    local_9c4 = 1;
                    local_b8 = (long)local_114 * (long)local_118 * local_130;
                    local_9b8 = (local_b8 + 0xfU & 0xfffffffffffffff0) / local_130;
                    local_9d0 = local_760->dims + -1;
                    if (local_760->dims == 4) {
                      local_9b8 = (long)local_760->w * (long)local_760->h;
                    }
                    local_bc = 0x10;
                    local_668 = local_760;
                    local_66c = local_908;
                    local_66d = 1;
                    local_9f9 = '\x01';
                    local_598 = &local_9f8;
                    local_59c = local_8dc;
                    local_bcc = *(float *)((long)local_128 +
                                          (long)local_8d8 * 4 +
                                          (long)local_114 * (long)local_8dc * local_130);
                    local_9f8 = local_128;
                    local_9e8 = local_130;
                    local_9e0 = local_134;
                    local_9d8 = local_140;
                    local_9cc = local_114;
                    local_9c8 = local_118;
                    local_9c0 = local_11c;
                  }
                  local_960 = local_b9c;
                  if (local_9f9 != '\0') {
                    local_6e0 = &local_9f8;
                    local_400 = local_6e0;
                    if (local_9f0 != (int *)0x0) {
                      local_404 = 0xffffffff;
                      LOCK();
                      local_408 = *local_9f0;
                      *local_9f0 = *local_9f0 + -1;
                      UNLOCK();
                      if (local_408 == 1) {
                        if (local_9d8 == (Allocator *)0x0) {
                          local_308 = local_9f8;
                          if (local_9f8 != (void *)0x0) {
                            free(local_9f8);
                          }
                        }
                        else {
                          (*local_9d8->_vptr_Allocator[3])(local_9d8,local_9f8);
                        }
                      }
                    }
                    local_9f8 = (void *)0x0;
                    local_9e8 = 0;
                    local_9e0 = 0;
                    local_9d0 = 0;
                    local_9cc = 0;
                    local_9c8 = 0;
                    local_9c4 = 0;
                    local_9c0 = 0;
                    local_9b8 = 0;
                    local_9f0 = (int *)0x0;
                  }
                  local_a49 = '\0';
                  if ((local_8f4 & 1U) == 0) {
                    local_bfc = 0.0;
                  }
                  else {
                    local_680 = &local_a48;
                    local_dc = local_760->w;
                    local_e0 = local_760->h;
                    local_e4 = local_760->d;
                    local_f0 = (void *)((long)local_760->data +
                                       local_760->cstep * (long)local_908 * local_760->elemsize);
                    local_f8 = local_760->elemsize;
                    local_fc = local_760->elempack;
                    local_108 = local_760->allocator;
                    local_d8 = &local_a48;
                    local_a40 = (int *)0x0;
                    local_a14 = 1;
                    local_c8 = (long)local_dc * (long)local_e0 * local_f8;
                    local_a08 = (local_c8 + 0xfU & 0xfffffffffffffff0) / local_f8;
                    local_a20 = local_760->dims + -1;
                    if (local_760->dims == 4) {
                      local_a08 = (long)local_760->w * (long)local_760->h;
                    }
                    local_cc = 0x10;
                    local_688 = local_760;
                    local_68c = local_908;
                    local_68d = 1;
                    local_a49 = '\x01';
                    local_5a8 = &local_a48;
                    local_5ac = local_8dc;
                    local_bfc = *(float *)((long)local_f0 +
                                          (long)local_8e0 * 4 +
                                          (long)local_dc * (long)local_8dc * local_f8);
                    local_a48 = local_f0;
                    local_a38 = local_f8;
                    local_a30 = local_fc;
                    local_a28 = local_108;
                    local_a1c = local_dc;
                    local_a18 = local_e0;
                    local_a10 = local_e4;
                  }
                  local_9b0 = local_bcc;
                  if (local_a49 != '\0') {
                    local_6d0 = &local_a48;
                    local_420 = local_6d0;
                    if (local_a40 != (int *)0x0) {
                      local_424 = 0xffffffff;
                      LOCK();
                      local_428 = *local_a40;
                      *local_a40 = *local_a40 + -1;
                      UNLOCK();
                      if (local_428 == 1) {
                        if (local_a28 == (Allocator *)0x0) {
                          local_2f8 = local_a48;
                          if (local_a48 != (void *)0x0) {
                            free(local_a48);
                          }
                        }
                        else {
                          (*local_a28->_vptr_Allocator[3])(local_a28,local_a48);
                        }
                      }
                    }
                    local_a48 = (void *)0x0;
                    local_a38 = 0;
                    local_a30 = 0;
                    local_a20 = 0;
                    local_a1c = 0;
                    local_a18 = 0;
                    local_a14 = 0;
                    local_a10 = 0;
                    local_a08 = 0;
                    local_a40 = (int *)0x0;
                  }
                  local_a00 = local_bfc;
                  local_90c = local_8e4 * local_910 + local_8e8 * local_960 + local_8ec * local_9b0
                              + local_8f0 * local_bfc;
                }
                local_7c0 = local_90c * local_874 *
                            *(float *)(local_7a0 +
                                      (long)(((local_7bc * local_778 + local_908) *
                                              *(int *)(in_RDI + 0xd8) + local_7c4) *
                                             *(int *)(in_RDI + 0xd4) + local_7c8) * 4) + local_7c0;
              }
            }
          }
          local_510 = *(undefined4 *)(in_RDI + 0x104);
          local_518 = (long *)(in_RDI + 0x108);
          local_50c = local_7c0;
          switch(local_510) {
          case 1:
            dVar4 = std::fmax((double)(ulong)(uint)local_7c0,0.0);
            local_50c = SUB84(dVar4,0);
            break;
          case 2:
            local_50 = 0;
            local_51c = *(float *)*local_518;
            local_48 = local_518;
            if (local_7c0 <= 0.0) {
              local_50c = local_7c0 * local_51c;
            }
            break;
          case 3:
            local_30 = 0;
            local_520 = *(float *)*local_518;
            local_40 = 1;
            local_524 = *(float *)(*local_518 + 4);
            if (local_7c0 < local_520) {
              local_50c = local_520;
            }
            local_38 = local_518;
            local_28 = local_518;
            if (local_524 < local_50c) {
              local_50c = local_524;
            }
            break;
          case 4:
            local_528 = 88.37626;
            pfVar2 = std::min<float>(&local_50c,&local_528);
            local_50c = *pfVar2;
            local_52c = -88.37626;
            pfVar2 = std::max<float>(&local_50c,&local_52c);
            local_50c = *pfVar2;
            dVar4 = std::exp((double)(ulong)(uint)-local_50c);
            local_50c = 1.0 / (SUB84(dVar4,0) + 1.0);
            break;
          case 5:
            fVar7 = local_7c0;
            auVar5._0_8_ = std::exp((double)(ulong)(uint)local_7c0);
            auVar5._8_8_ = extraout_XMM0_Qb;
            auVar6._4_12_ = auVar5._4_12_;
            auVar6._0_4_ = SUB84(auVar5._0_8_,0) + 1.0;
            dVar4 = std::log(auVar6._0_8_);
            dVar4 = std::tanh(dVar4);
            local_50c = fVar7 * SUB84(dVar4,0);
            break;
          case 6:
            local_10 = 0;
            local_530 = *(float *)*local_518;
            local_20 = 1;
            local_534 = *(float *)(*local_518 + 4);
            local_538 = -local_534 / local_530;
            local_53c = 1.0 / local_530 + local_538;
            local_18 = local_518;
            local_8 = local_518;
            if (local_538 <= local_7c0) {
              if (local_7c0 <= local_53c) {
                local_50c = local_7c0 * (local_7c0 * local_530 + local_534);
              }
            }
            else {
              local_50c = 0.0;
            }
          }
          local_4f8 = &local_a98;
          local_264 = local_798->w;
          local_268 = local_798->h;
          local_26c = local_798->d;
          local_278 = (void *)((long)local_798->data +
                              local_798->cstep * (long)local_7bc * local_798->elemsize);
          local_280 = local_798->elemsize;
          local_284 = local_798->elempack;
          local_290 = local_798->allocator;
          local_260 = &local_a98;
          local_58 = (long)local_264 * (long)local_268 * local_280;
          local_5c = 0x10;
          local_500 = local_798;
          local_504 = local_7bc;
          local_505 = 1;
          local_4e0 = &local_a98;
          local_4e4 = local_7ac;
          *(float *)((long)local_278 +
                    (long)local_7b0 * 4 + (long)local_264 * (long)local_7ac * local_280) = local_50c
          ;
          local_6c0 = &local_a98;
          local_a98 = 0;
          local_a88 = 0;
          local_a80 = 0;
          local_a70 = 0;
          local_a6c = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a58 = 0;
          local_a90 = 0;
          local_440 = local_6c0;
          local_a78 = local_290;
        }
      }
    }
    local_734 = 0;
  }
  return local_734;
}

Assistant:

int DeformableConv2D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output.shape is [num_output, out_h, out_w] (in python).
    Mat& output = top_blobs[0];
    output.create(out_w, out_h, num_output, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    const float* weight_ptr = weight_data;
    const float* bias_ptr = weight_data;
    if (bias_term)
        bias_ptr = bias_data;

    // deformable conv
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < num_output; oc++)
            {
                float sum = 0.f;
                if (bias_term)
                    sum = bias_ptr[oc];
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        const float offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                        const float offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        int h_low = 0;
                        int w_low = 0;
                        int h_high = 0;
                        int w_high = 0;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        if (cond)
                        {
                            h_low = floor(h_im);
                            w_low = floor(w_im);
                            h_high = h_low + 1;
                            w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }

                        for (int c_im = 0; c_im < in_c; c_im++)
                        {
                            float val = 0.f;
                            if (cond)
                            {
                                float v1 = v1_cond ? bottom_blob.channel(c_im).row(h_low)[w_low] : 0.f;
                                float v2 = v2_cond ? bottom_blob.channel(c_im).row(h_low)[w_high] : 0.f;
                                float v3 = v3_cond ? bottom_blob.channel(c_im).row(h_high)[w_low] : 0.f;
                                float v4 = v4_cond ? bottom_blob.channel(c_im).row(h_high)[w_high] : 0.f;
                                val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                            }
                            sum += val * mask_ * weight_ptr[((oc * in_c + c_im) * kernel_h + i) * kernel_w + j];
                        }
                    }
                }
                output.channel(oc).row(h_col)[w_col] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    return 0;
}